

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

bool __thiscall doctest::detail::TestCase::operator<(TestCase *this,TestCase *other)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  
  uVar1 = (other->super_TestCaseData).m_line;
  uVar2 = (this->super_TestCaseData).m_line;
  if (uVar2 == uVar1) {
    iVar4 = strcmp((this->super_TestCaseData).m_name,(other->super_TestCaseData).m_name);
    if (iVar4 == 0) {
      iVar4 = String::compare((String *)this,(String *)other,false);
      bVar3 = this->m_template_id < other->m_template_id;
      if (iVar4 != 0) {
        bVar3 = iVar4 < 0;
      }
    }
    else {
      bVar3 = SUB41((uint)iVar4 >> 0x1f,0);
    }
    return bVar3;
  }
  return uVar2 < uVar1;
}

Assistant:

bool TestCase::operator<(const TestCase& other) const {
        // this will be used only to differentiate between test cases - not relevant for sorting
        if(m_line != other.m_line)
            return m_line < other.m_line;
        const int name_cmp = strcmp(m_name, other.m_name);
        if(name_cmp != 0)
            return name_cmp < 0;
        const int file_cmp = m_file.compare(other.m_file);
        if(file_cmp != 0)
            return file_cmp < 0;
        return m_template_id < other.m_template_id;
    }